

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_dupset(SessionHandle *dst,SessionHandle *src)

{
  char **__s;
  bool bVar1;
  char *pcVar2;
  size_t length;
  CURLcode CVar3;
  long lVar4;
  
  memcpy(&dst->set,&src->set,0x510);
  __s = (dst->set).str;
  lVar4 = 0;
  memset(__s,0,0x150);
  while( true ) {
    pcVar2 = (src->set).str[lVar4];
    (*Curl_cfree)(__s[lVar4]);
    __s[lVar4] = (char *)0x0;
    bVar1 = true;
    if (pcVar2 == (char *)0x0) {
      CVar3 = CURLE_OK;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(pcVar2);
      CVar3 = CURLE_OK;
      if (pcVar2 == (char *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
        bVar1 = false;
      }
      else {
        __s[lVar4] = pcVar2;
      }
    }
    if (!bVar1) break;
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x28) {
      lVar4 = (src->set).postfieldsize;
      CVar3 = CURLE_OK;
      if ((lVar4 != 0) && (pcVar2 = (src->set).str[0x29], pcVar2 != (char *)0x0)) {
        length = curlx_sotouz(lVar4);
        pcVar2 = Curl_memdup(pcVar2,length);
        (dst->set).str[0x29] = pcVar2;
        if (pcVar2 == (char *)0x0) {
          CVar3 = CURLE_OUT_OF_MEMORY;
        }
        else {
          (dst->set).postfields = pcVar2;
          CVar3 = CURLE_OK;
        }
      }
      return CVar3;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_dupset(struct SessionHandle *dst, struct SessionHandle *src)
{
  CURLcode result = CURLE_OK;
  enum dupstring i;

  /* Copy src->set into dst->set first, then deal with the strings
     afterwards */
  dst->set = src->set;

  /* clear all string pointers first */
  memset(dst->set.str, 0, STRING_LAST * sizeof(char *));

  /* duplicate all strings */
  for(i=(enum dupstring)0; i< STRING_LASTZEROTERMINATED; i++) {
    result = setstropt(&dst->set.str[i], src->set.str[i]);
    if(result)
      return result;
  }

  /* duplicate memory areas pointed to */
  i = STRING_COPYPOSTFIELDS;
  if(src->set.postfieldsize && src->set.str[i]) {
    /* postfieldsize is curl_off_t, Curl_memdup() takes a size_t ... */
    dst->set.str[i] = Curl_memdup(src->set.str[i],
                                  curlx_sotouz(src->set.postfieldsize));
    if(!dst->set.str[i])
      return CURLE_OUT_OF_MEMORY;
    /* point to the new copy */
    dst->set.postfields = dst->set.str[i];
  }

  return CURLE_OK;
}